

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void set_closure_from_var(JSContext *ctx,JSClosureVar *cv,JSVarDef *vd,int var_idx)

{
  long lVar1;
  JSAtom JVar2;
  undefined2 in_CX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  JSContext *in_RSI;
  
  lVar1 = CONCAT71(in_register_00000011,in_DL);
  *(byte *)&(in_RSI->header).ref_count = (byte)(in_RSI->header).ref_count & 0xfe | 1;
  *(byte *)&(in_RSI->header).ref_count = (byte)(in_RSI->header).ref_count & 0xfd;
  *(byte *)&(in_RSI->header).ref_count =
       (byte)(in_RSI->header).ref_count & 0xfb | ((byte)*(undefined4 *)(lVar1 + 0xc) & 1) << 2;
  *(byte *)&(in_RSI->header).ref_count =
       (byte)(in_RSI->header).ref_count & 0xf7 | ((byte)(*(uint *)(lVar1 + 0xc) >> 1) & 1) << 3;
  *(byte *)&(in_RSI->header).ref_count =
       (byte)(in_RSI->header).ref_count & 0xf | (char)(*(uint *)(lVar1 + 0xc) >> 3) << 4;
  *(undefined2 *)((long)&(in_RSI->header).ref_count + 2) = in_CX;
  JVar2 = JS_DupAtom(in_RSI,(JSAtom)((uint7)in_register_00000011 >> 0x18));
  *(JSAtom *)&(in_RSI->header).field_0x4 = JVar2;
  return;
}

Assistant:

static void set_closure_from_var(JSContext *ctx, JSClosureVar *cv,
                                 JSVarDef *vd, int var_idx)
{
    cv->is_local = TRUE;
    cv->is_arg = FALSE;
    cv->is_const = vd->is_const;
    cv->is_lexical = vd->is_lexical;
    cv->var_kind = vd->var_kind;
    cv->var_idx = var_idx;
    cv->var_name = JS_DupAtom(ctx, vd->var_name);
}